

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O2

hrgls_Status hrgls_DataBlobSourceSetStreamingState(hrgls_DataBlobSource stream,bool running)

{
  hrgls_Status hVar1;
  
  if (stream != (hrgls_DataBlobSource)0x0) {
    hVar1 = hrgls::datablob::DataBlobSource::SetStreamingState(stream->stream,running);
    return hVar1;
  }
  return 0x3ee;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceSetStreamingState(hrgls_DataBlobSource stream,
    bool running)
  {
    if (!stream) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    try {
      return stream->stream->SetStreamingState(running);
    }
    catch (...) {
      return hrgls_STATUS_INTERNAL_EXCEPTION;
    }
  }